

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.hpp
# Opt level: O0

bool __thiscall
OpenMD::FragmentStamp::
addIndexSensitiveStamp<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>,OpenMD::RigidBodyStamp>
          (FragmentStamp *this,
          vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *cont,
          RigidBodyStamp *stamp)

{
  uint uVar1;
  const_iterator __position;
  reference ppRVar2;
  iterator __n;
  RigidBodyStamp *in_RDX;
  vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *in_RSI;
  size_t size;
  bool ret;
  uint index;
  vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
  *in_stack_ffffffffffffff98;
  vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_> *this_00;
  vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
  *in_stack_ffffffffffffffd0;
  undefined1 local_1d;
  
  uVar1 = RigidBodyStamp::getIndex(in_RDX);
  __position._M_current =
       (RigidBodyStamp **)
       std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::size
                 (in_RSI);
  if (__position._M_current < (RigidBodyStamp **)(ulong)(uVar1 + 1)) {
    this_00 = in_RSI;
    __n = std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::end
                    (in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<OpenMD::RigidBodyStamp*const*,std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>>
    ::__normal_iterator<OpenMD::RigidBodyStamp**>
              ((__normal_iterator<OpenMD::RigidBodyStamp_*const_*,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
                *)this_00,
               (__normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
                *)in_stack_ffffffffffffff98);
    std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::size(in_RSI);
    std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::insert
              (in_stack_ffffffffffffffd0,__position,(size_type)__n._M_current,(value_type *)0x0);
    ppRVar2 = std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::
              operator[](in_RSI,(ulong)uVar1);
    *ppRVar2 = in_RDX;
    local_1d = true;
  }
  else {
    ppRVar2 = std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::
              operator[](in_RSI,(ulong)uVar1);
    local_1d = *ppRVar2 == (value_type)0x0;
    if (local_1d) {
      ppRVar2 = std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::
                operator[](in_RSI,(ulong)uVar1);
      *ppRVar2 = in_RDX;
    }
  }
  return local_1d;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }